

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::RunContext::testForMissingAssertions(RunContext *this,Counts *assertions)

{
  uint uVar1;
  size_t sVar2;
  element_type *peVar3;
  ITracker *pIVar4;
  Counts *assertions_local;
  RunContext *this_local;
  
  sVar2 = Counts::total(assertions);
  if (sVar2 == 0) {
    peVar3 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_config);
    uVar1 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[7])();
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      pIVar4 = TestCaseTracking::TrackerContext::currentTracker(&this->m_trackerContext);
      uVar1 = (*pIVar4->_vptr_ITracker[5])();
      if ((uVar1 & 1) == 0) {
        (this->m_totals).assertions.failed = (this->m_totals).assertions.failed + 1;
        assertions->failed = assertions->failed + 1;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RunContext::testForMissingAssertions(Counts& assertions) {
        if (assertions.total() != 0)
            return false;
        if (!m_config->warnAboutMissingAssertions())
            return false;
        if (m_trackerContext.currentTracker().hasChildren())
            return false;
        m_totals.assertions.failed++;
        assertions.failed++;
        return true;
    }